

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

void __thiscall
kratos::ModportPort::ModportPort(ModportPort *this,InterfaceRef *ref,Var *var,PortDirection dir)

{
  bool bVar1;
  int iVar2;
  uint32_t width;
  undefined4 extraout_var;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size;
  bool *pbVar3;
  PortDirection dir_local;
  Var *var_local;
  InterfaceRef *ref_local;
  ModportPort *this_local;
  
  iVar2 = (*(var->super_IRNode)._vptr_IRNode[0xd])();
  width = (*(var->super_IRNode)._vptr_IRNode[7])();
  size = Var::size(var);
  pbVar3 = Var::is_signed(var);
  InterfacePort::InterfacePort
            (&this->super_InterfacePort,ref,(Generator *)CONCAT44(extraout_var,iVar2),dir,&var->name
             ,width,size,Data,(bool)(*pbVar3 & 1));
  (this->super_InterfacePort).super_Port.super_Var.super_IRNode._vptr_IRNode =
       (_func_int **)&PTR_accept_005a8590;
  this->var_ = var;
  bVar1 = Var::explicit_array(var);
  (this->super_InterfacePort).super_Port.super_Var.explicit_array_ = bVar1;
  return;
}

Assistant:

ModportPort::ModportPort(InterfaceRef* ref, kratos::Var* var, kratos::PortDirection dir)
    : InterfacePort(ref, var->generator(), dir, var->name, var->width(), var->size(),
                    PortType::Data, var->is_signed()),
      var_(var) {
    explicit_array_ = var->explicit_array();
}